

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O2

DynamicObject * __thiscall
JsrtDebuggerObjectGlobalsNode::GetJSONObject
          (JsrtDebuggerObjectGlobalsNode *this,ScriptContext *scriptContext,bool forceSetValueProp)

{
  IDiagObjectModelDisplay *pIVar1;
  DynamicObject *object;
  
  pIVar1 = Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::GetStrongReference
                     (this->objectDisplay);
  if (pIVar1 == (IDiagObjectModelDisplay *)0x0) {
    object = (DynamicObject *)0x0;
  }
  else {
    object = Js::JavascriptLibrary::CreateObject
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
    JsrtDebugUtils::AddPropertyToObject
              (object,(JsrtDebugPropertyId)0xe,(this->super_JsrtDebuggerObjectBase).handle,
               scriptContext);
    Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::ReleaseStrongReference
              (this->objectDisplay);
  }
  return object;
}

Assistant:

Js::DynamicObject * JsrtDebuggerObjectGlobalsNode::GetJSONObject(Js::ScriptContext * scriptContext, bool forceSetValueProp)
{
    Js::IDiagObjectModelDisplay* objectDisplayRef = this->objectDisplay->GetStrongReference();

    Js::DynamicObject* globalsNode = nullptr;

    if (objectDisplayRef != nullptr)
    {
        globalsNode = scriptContext->GetLibrary()->CreateObject();
        JsrtDebugUtils::AddPropertyToObject(globalsNode, JsrtDebugPropertyId::handle, this->GetHandle(), scriptContext);
        this->objectDisplay->ReleaseStrongReference();
    }

    return globalsNode;
}